

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

StringRef __thiscall Catch::trim(Catch *this,StringRef ref)

{
  Catch *pCVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  StringRef SVar11;
  ulong uVar7;
  
  pcVar8 = ref.m_start;
  pcVar2 = pcVar8;
  pcVar3 = pcVar8;
  if (pcVar8 != (char *)0x0) {
    bVar10 = true;
    pcVar4 = (char *)0x0;
    do {
      if ((0x20 < (ulong)(byte)this[(long)pcVar4]) ||
         ((0x100002600U >> ((ulong)(byte)this[(long)pcVar4] & 0x3f) & 1) == 0))
      goto joined_r0x0014cffd;
      pcVar4 = pcVar4 + 1;
      bVar10 = pcVar4 < pcVar8;
      pcVar5 = pcVar8;
      pcVar6 = pcVar8;
    } while (pcVar4 != pcVar8);
LAB_0014d037:
    uVar9 = (long)pcVar8 - (long)pcVar5;
    if ((ulong)((long)pcVar6 - (long)pcVar5) <= (ulong)((long)pcVar8 - (long)pcVar5)) {
      uVar9 = (long)pcVar6 - (long)pcVar5;
    }
    uVar7 = 0;
    pCVar1 = (Catch *)0x18ec8b;
    if (bVar10) {
      uVar7 = uVar9;
      pCVar1 = this + (long)pcVar5;
    }
    SVar11.m_size = uVar7;
    SVar11.m_start = (char *)pCVar1;
    return SVar11;
  }
  pcVar4 = (char *)0x0;
  bVar10 = false;
joined_r0x0014cffd:
  do {
    pcVar5 = pcVar4;
    pcVar6 = pcVar3;
    if (pcVar2 <= pcVar4) goto LAB_0014d037;
    if (pcVar8 <= pcVar2 + -1) {
      __assert_fail("index < m_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                    ,0x2ac,"char Catch::StringRef::operator[](size_type) const");
    }
    pCVar1 = this + -1 + (long)pcVar2;
    pcVar6 = pcVar2;
    if ((0x20 < (ulong)(byte)*pCVar1) ||
       (pcVar2 = pcVar2 + -1, pcVar3 = pcVar4,
       (0x100002600U >> ((ulong)(byte)*pCVar1 & 0x3f) & 1) == 0)) goto LAB_0014d037;
  } while( true );
}

Assistant:

StringRef trim(StringRef ref) {
        const auto is_ws = [](char c) {
            return c == ' ' || c == '\t' || c == '\n' || c == '\r';
        };
        size_t real_begin = 0;
        while (real_begin < ref.size() && is_ws(ref[real_begin])) { ++real_begin; }
        size_t real_end = ref.size();
        while (real_end > real_begin && is_ws(ref[real_end - 1])) { --real_end; }

        return ref.substr(real_begin, real_end - real_begin);
    }